

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDFile.cpp
# Opt level: O3

void __thiscall BRDFile::BRDFile(BRDFile *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  pointer *ppBVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  BRDPinSide BVar5;
  pointer __src;
  char *pcVar6;
  iterator __position;
  iterator __position_00;
  pointer pBVar7;
  mapped_type pcVar8;
  pointer pBVar9;
  bool bVar10;
  size_t __size;
  pointer pcVar11;
  BRDFileBase *pBVar12;
  int iVar13;
  uint uVar14;
  size_t i;
  int *buffer;
  ulong uVar15;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  int extraout_var_05;
  int extraout_var_06;
  int extraout_var_07;
  int extraout_var_08;
  int extraout_var_09;
  BRDPoint *pBVar16;
  long lVar17;
  BRDPoint BVar18;
  BRDPoint extraout_RAX;
  BRDPoint extraout_RAX_00;
  BRDPoint extraout_RAX_01;
  BRDPoint extraout_RAX_02;
  mapped_type *ppcVar19;
  iterator iVar20;
  undefined8 uVar21;
  long *plVar22;
  undefined8 *puVar23;
  value_type *pvVar24;
  size_type *psVar25;
  long *plVar26;
  anon_class_16_2_d7082a65 *paVar27;
  value_type vVar28;
  ulong *puVar29;
  size_t __n;
  undefined8 uVar30;
  byte bVar31;
  BRDNail *nail_1;
  pointer pBVar32;
  ulong uVar33;
  pointer pBVar34;
  int iVar35;
  char **ppcVar36;
  BRDNail nail;
  string __str;
  char *p;
  unordered_map<int,_const_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
  nailsToNets;
  char *arena_end;
  char *arena;
  char *s;
  vector<char_*,_std::allocator<char_*>_> lines;
  undefined1 local_208 [24];
  char **ppcStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string *local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  char *pcStack_d0;
  uint uStack_c8;
  int iStack_c4;
  int iStack_c0;
  BRDPoint BStack_bc;
  BRDFileBase *local_a8;
  char *local_a0;
  __node_base local_98;
  string local_90;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long local_58;
  vector<BRDPin,std::allocator<BRDPin>> *local_50;
  vector<BRDNail,std::allocator<BRDNail>> *local_48;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_40;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022b310;
  uVar33 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_a8 = &this->super_BRDFileBase;
  if (4 < uVar33) {
    __size = (uVar33 + 1) * 3;
    buffer = (int *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = (char *)buffer;
    if (buffer != (int *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(buffer,__src,__n);
      }
      *(undefined1 *)((long)buffer + uVar33) = 0;
      local_98._M_nxt = (_Hash_node_base *)(uVar33 + 1 + (long)buffer);
      local_a0 = (char *)((long)buffer + (__size - 1));
      *(undefined1 *)((long)buffer + (__size - 1)) = 0;
      if (*buffer == 0x2863e223) {
        uVar15 = 0;
        do {
          pcVar6 = (this->super_BRDFileBase).file_buf;
          bVar31 = pcVar6[uVar15];
          if ((0xd < bVar31) || ((0x2401U >> (bVar31 & 0x1f) & 1) == 0)) {
            bVar31 = ~(((byte)((uint)(int)(char)bVar31 >> 6) & 3) + bVar31 * '\x04');
          }
          pcVar6[uVar15] = bVar31;
          uVar15 = uVar15 + 1;
        } while (uVar33 != uVar15);
        buffer = (int *)(this->super_BRDFileBase).file_buf;
      }
      local_68._M_allocated_capacity = 0;
      local_68._8_8_ = (long *)0x0;
      local_58 = 0;
      stringfile((char *)buffer,(vector<char_*,_std::allocator<char_*>_> *)&local_68);
      uVar21 = local_68._8_8_;
      local_108 = (string *)0x0;
      if (local_68._M_allocated_capacity != local_68._8_8_) {
        local_48 = (vector<BRDNail,std::allocator<BRDNail>> *)&(this->super_BRDFileBase).nails;
        local_108 = (string *)&(this->super_BRDFileBase).error_msg;
        local_50 = (vector<BRDPin,std::allocator<BRDPin>> *)&(this->super_BRDFileBase).pins;
        local_40 = &(this->super_BRDFileBase).parts;
        local_38 = &(this->super_BRDFileBase).format;
        iVar35 = 0;
        uVar30 = local_68._M_allocated_capacity;
        do {
          ppcVar36 = (char **)(*(long *)uVar30 + -1);
          do {
            bVar31 = *(byte *)((long)ppcVar36 + 1);
            ppcVar36 = (char **)((long)ppcVar36 + 1);
            BVar18.x = isspace((uint)bVar31);
            BVar18.y = extraout_var;
          } while (BVar18.x != 0);
          this = (BRDFile *)local_a8;
          iVar13 = iVar35;
          if (bVar31 != 0) {
            BVar18.x = strcmp((char *)ppcVar36,"str_length:");
            this = (BRDFile *)local_a8;
            BVar18.y = extraout_var_00;
            if (BVar18.x == 0) {
              iVar13 = 1;
            }
            else {
              BVar18.x = strcmp((char *)ppcVar36,"var_data:");
              BVar18.y = extraout_var_01;
              if (BVar18.x == 0) {
                iVar13 = 2;
              }
              else {
                BVar18.x = strcmp((char *)ppcVar36,"Format:");
                BVar18.y = extraout_var_02;
                iVar13 = 3;
                if (BVar18.x != 0) {
                  BVar18.x = strcmp((char *)ppcVar36,"format:");
                  BVar18.y = extraout_var_03;
                  if (BVar18.x != 0) {
                    BVar18.x = strcmp((char *)ppcVar36,"Parts:");
                    BVar18.y = extraout_var_04;
                    iVar13 = 4;
                    if (BVar18.x != 0) {
                      BVar18.x = strcmp((char *)ppcVar36,"Pins1:");
                      BVar18.y = extraout_var_05;
                      if (BVar18.x != 0) {
                        BVar18.x = strcmp((char *)ppcVar36,"Pins:");
                        BVar18.y = extraout_var_06;
                        iVar13 = 5;
                        if (BVar18.x != 0) {
                          BVar18.x = strcmp((char *)ppcVar36,"Pins2:");
                          BVar18.y = extraout_var_07;
                          if (BVar18.x != 0) {
                            BVar18.x = strcmp((char *)ppcVar36,"Nails:");
                            BVar18.y = extraout_var_08;
                            if (BVar18.x == 0) {
                              iVar13 = 6;
                            }
                            else {
                              BVar18.y = 0;
                              BVar18.x = iVar35 - 2;
                              iVar13 = iVar35;
                              local_100 = (undefined1  [8])ppcVar36;
                              switch(BVar18) {
                              case (BRDPoint)0x0:
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                (this->super_BRDFileBase).num_format = uVar14;
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                (this->super_BRDFileBase).num_parts = uVar14;
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                (this->super_BRDFileBase).num_pins = uVar14;
                                BVar18.x = BRDFile::anon_class_16_2_d7082a65::operator()
                                                     ((anon_class_16_2_d7082a65 *)local_100);
                                BVar18.y = extraout_var_09;
                                (this->super_BRDFileBase).num_nails = BVar18.x;
                                break;
                              case (BRDPoint)0x1:
                                if ((ulong)(this->super_BRDFileBase).num_format <=
                                    (ulong)((long)(this->super_BRDFileBase).format.
                                                  super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->super_BRDFileBase).format.
                                                  super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_188._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x61);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  puVar23 = (undefined8 *)
                                            std::__cxx11::string::append((char *)&local_1a8);
                                  local_208._0_8_ = local_208 + 0x10;
                                  paVar27 = (anon_class_16_2_d7082a65 *)(puVar23 + 2);
                                  if ((anon_class_16_2_d7082a65 *)*puVar23 == paVar27) {
                                    local_208._16_8_ = paVar27->p;
                                    ppcStack_1f0 = (char **)puVar23[3];
                                  }
                                  else {
                                    local_208._16_8_ = paVar27->p;
                                    local_208._0_8_ = (anon_class_16_2_d7082a65 *)*puVar23;
                                  }
                                  local_208._8_8_ = puVar23[1];
                                  *puVar23 = paVar27;
                                  puVar23[1] = 0;
                                  *(undefined1 *)(puVar23 + 2) = 0;
                                  pvVar24 = (value_type *)std::__cxx11::string::append(local_208);
                                  vVar28 = (value_type)(pvVar24 + 2);
                                  if (*pvVar24 == vVar28) {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar24[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    local_f8._0_8_ = *pvVar24;
                                  }
                                  local_f8._8_8_ = pvVar24[1];
                                  *pvVar24 = vVar28;
                                  pvVar24[1].x = 0;
                                  pvVar24[1].y = 0;
                                  *(undefined1 *)&pvVar24[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((anon_class_16_2_d7082a65 *)local_208._0_8_ !=
                                      (anon_class_16_2_d7082a65 *)(local_208 + 0x10)) {
                                    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_f8._0_4_ = (int)lVar17;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_f8._4_4_ = (int)lVar17;
                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back
                                          (local_38,(value_type *)local_f8);
                                BVar18 = extraout_RAX_00;
                                break;
                              case (BRDPoint)0x2:
                                if ((ulong)(this->super_BRDFileBase).num_parts <=
                                    (ulong)(((long)(this->super_BRDFileBase).parts.
                                                                                                      
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->super_BRDFileBase).parts.
                                                                                                      
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x71c71c71c71c71c7)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_188._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x68);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208._0_8_ = local_208 + 0x10;
                                  ppcVar36 = (char **)(plVar22 + 2);
                                  if ((char **)*plVar22 == ppcVar36) {
                                    local_208._16_8_ = *ppcVar36;
                                    ppcStack_1f0 = (char **)plVar22[3];
                                  }
                                  else {
                                    local_208._16_8_ = *ppcVar36;
                                    local_208._0_8_ = (char **)*plVar22;
                                  }
                                  local_208._8_8_ = plVar22[1];
                                  *plVar22 = (long)ppcVar36;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  pvVar24 = (value_type *)std::__cxx11::string::append(local_208);
                                  vVar28 = (value_type)(pvVar24 + 2);
                                  if (*pvVar24 == vVar28) {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar24[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    local_f8._0_8_ = *pvVar24;
                                  }
                                  local_f8._8_8_ = pvVar24[1];
                                  *pvVar24 = vVar28;
                                  pvVar24[1].x = 0;
                                  pvVar24[1].y = 0;
                                  *(undefined1 *)&pvVar24[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
                                    operator_delete((void *)local_208._0_8_,
                                                    (ulong)(local_208._16_8_ + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                local_f8._8_8_ = &aStack_e0;
                                local_f8._16_8_ = (__node_base *)0x0;
                                aStack_e0._M_allocated_capacity =
                                     aStack_e0._M_allocated_capacity & 0xffffffffffffff00;
                                iStack_c0 = 0;
                                BStack_bc.x = 0;
                                BStack_bc.y = 0;
                                pcStack_d0 = (char *)0x0;
                                uStack_c8 = 0;
                                iStack_c4 = 0;
                                local_208._8_8_ = &local_70;
                                local_208._16_8_ = &local_98;
                                ppcStack_1f0 = &local_a0;
                                local_208._0_8_ = (anon_class_16_2_d7082a65 *)local_100;
                                local_f8._0_8_ =
                                     BRDFile::anon_class_32_4_fa413470::operator()
                                               ((anon_class_32_4_fa413470 *)local_208);
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                bVar10 = 7 < uVar14 || uVar14 == 2;
                                if (((bVar10) || (uVar14 == 1)) || ((uVar14 & 0xfffffffc) == 4)) {
                                  pcStack_d0._0_4_ = Top - bVar10;
                                }
                                pcStack_d0 = (char *)(ulong)CONCAT14((uVar14 & 0xc) == 0,
                                                                     (BRDPartMountingSide)pcStack_d0
                                                                    );
                                uStack_c8 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                      ((anon_class_16_2_d7082a65 *)local_100);
                                if ((this->super_BRDFileBase).num_pins < uStack_c8) {
                                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_128,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_128)
                                  ;
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_148.field_2._M_allocated_capacity = *psVar25;
                                    local_148.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_148.field_2._M_allocated_capacity = *psVar25;
                                    local_148._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_148._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_90,0x70);
                                  std::operator+(&local_188,&local_148,&local_90);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_188)
                                  ;
                                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_168.field_2._M_allocated_capacity = *psVar25;
                                    local_168.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_168.field_2._M_allocated_capacity = *psVar25;
                                    local_168._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_168._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  puVar23 = (undefined8 *)
                                            std::__cxx11::string::append((char *)&local_1a8);
                                  paVar27 = (anon_class_16_2_d7082a65 *)(puVar23 + 2);
                                  if ((anon_class_16_2_d7082a65 *)*puVar23 == paVar27) {
                                    local_208._16_8_ = paVar27->p;
                                    ppcStack_1f0 = (char **)puVar23[3];
                                    local_208._0_8_ = (anon_class_16_2_d7082a65 *)(local_208 + 0x10)
                                    ;
                                  }
                                  else {
                                    local_208._16_8_ = paVar27->p;
                                    local_208._0_8_ = (anon_class_16_2_d7082a65 *)*puVar23;
                                  }
                                  local_208._8_8_ = puVar23[1];
                                  *puVar23 = paVar27;
                                  puVar23[1] = 0;
                                  *(undefined1 *)(puVar23 + 2) = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_208);
                                  if ((anon_class_16_2_d7082a65 *)local_208._0_8_ !=
                                      (anon_class_16_2_d7082a65 *)(local_208 + 0x10)) {
                                    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                    operator_delete(local_90._M_dataplus._M_p,
                                                    local_90.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                          (local_40,(value_type *)local_f8);
                                BVar18 = (BRDPoint)&aStack_e0;
                                if ((BRDPoint)local_f8._8_8_ != BVar18) {
                                  operator_delete((void *)local_f8._8_8_,
                                                  aStack_e0._M_allocated_capacity + 1);
                                  BVar18 = extraout_RAX_02;
                                }
                                break;
                              case (BRDPoint)0x3:
                                if ((ulong)(this->super_BRDFileBase).num_pins <=
                                    (ulong)(((long)(this->super_BRDFileBase).pins.
                                                                                                      
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->super_BRDFileBase).pins.
                                                                                                      
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           0x6db6db6db6db6db7)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_188._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x74);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  puVar23 = (undefined8 *)
                                            std::__cxx11::string::append((char *)&local_1a8);
                                  local_208._0_8_ = local_208 + 0x10;
                                  paVar27 = (anon_class_16_2_d7082a65 *)(puVar23 + 2);
                                  if ((anon_class_16_2_d7082a65 *)*puVar23 == paVar27) {
                                    local_208._16_8_ = paVar27->p;
                                    ppcStack_1f0 = (char **)puVar23[3];
                                  }
                                  else {
                                    local_208._16_8_ = paVar27->p;
                                    local_208._0_8_ = (anon_class_16_2_d7082a65 *)*puVar23;
                                  }
                                  local_208._8_8_ = puVar23[1];
                                  *puVar23 = paVar27;
                                  puVar23[1] = 0;
                                  *(undefined1 *)(puVar23 + 2) = 0;
                                  pvVar24 = (value_type *)std::__cxx11::string::append(local_208);
                                  vVar28 = (value_type)(pvVar24 + 2);
                                  if (*pvVar24 == vVar28) {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    aStack_e0._M_allocated_capacity = (size_type)pvVar24[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)vVar28;
                                    local_f8._0_8_ = *pvVar24;
                                  }
                                  local_f8._8_8_ = pvVar24[1];
                                  *pvVar24 = vVar28;
                                  pvVar24[1].x = 0;
                                  pvVar24[1].y = 0;
                                  *(undefined1 *)&pvVar24[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((anon_class_16_2_d7082a65 *)local_208._0_8_ !=
                                      (anon_class_16_2_d7082a65 *)(local_208 + 0x10)) {
                                    operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_f8._0_4_ = 0;
                                local_f8._4_4_ = 0;
                                local_f8._8_8_ = (char **)0x0;
                                local_f8._16_8_ = local_f8._16_8_ & 0xffffffff00000000;
                                aStack_e0._M_allocated_capacity = 0x1ea23f;
                                aStack_e0._8_8_ = 0.5;
                                pcStack_d0 = (char *)0x0;
                                uStack_c8 = 0;
                                iStack_c4 = 0;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_f8._0_4_ = (int)lVar17;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_f8._4_4_ = (int)lVar17;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_f8._8_4_ = (int)lVar17;
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                local_f8._12_4_ = uVar14;
                                if ((this->super_BRDFileBase).num_parts < uVar14) {
                                  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_128,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_128)
                                  ;
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_148.field_2._M_allocated_capacity = *psVar25;
                                    local_148.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_148.field_2._M_allocated_capacity = *psVar25;
                                    local_148._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_148._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_90,0x7a);
                                  std::operator+(&local_188,&local_148,&local_90);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_188)
                                  ;
                                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_168.field_2._M_allocated_capacity = *psVar25;
                                    local_168.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_168.field_2._M_allocated_capacity = *psVar25;
                                    local_168._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_168._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  ppcVar36 = (char **)(plVar22 + 2);
                                  if ((char **)*plVar22 == ppcVar36) {
                                    local_208._16_8_ = *ppcVar36;
                                    ppcStack_1f0 = (char **)plVar22[3];
                                    local_208._0_8_ = local_208 + 0x10;
                                  }
                                  else {
                                    local_208._16_8_ = *ppcVar36;
                                    local_208._0_8_ = (char **)*plVar22;
                                  }
                                  local_208._8_8_ = plVar22[1];
                                  *plVar22 = (long)ppcVar36;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_208);
                                  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
                                    operator_delete((void *)local_208._0_8_,
                                                    (ulong)(local_208._16_8_ + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                                    operator_delete(local_90._M_dataplus._M_p,
                                                    local_90.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_208._0_8_ = local_100;
                                local_208._8_8_ = &local_70;
                                local_208._16_8_ = &local_98;
                                ppcStack_1f0 = &local_a0;
                                aStack_e0._M_allocated_capacity =
                                     (size_type)
                                     BRDFile::anon_class_32_4_fa413470::operator()
                                               ((anon_class_32_4_fa413470 *)local_208);
                                __position_00._M_current =
                                     (this->super_BRDFileBase).pins.
                                     super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                if (__position_00._M_current ==
                                    (this->super_BRDFileBase).pins.
                                    super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<BRDPin,std::allocator<BRDPin>>::
                                  _M_realloc_insert<BRDPin_const&>
                                            (local_50,__position_00,(BRDPin *)local_f8);
                                  BVar18 = extraout_RAX_01;
                                }
                                else {
                                  BVar18.y = iStack_c4;
                                  BVar18.x = uStack_c8;
                                  (__position_00._M_current)->name = (char *)BVar18;
                                  (__position_00._M_current)->radius = (double)aStack_e0._8_8_;
                                  (__position_00._M_current)->snum = pcStack_d0;
                                  *(undefined8 *)&(__position_00._M_current)->side = local_f8._16_8_
                                  ;
                                  (__position_00._M_current)->net =
                                       (char *)aStack_e0._M_allocated_capacity;
                                  ((__position_00._M_current)->pos).x = local_f8._0_4_;
                                  ((__position_00._M_current)->pos).y = local_f8._4_4_;
                                  (__position_00._M_current)->probe = local_f8._8_4_;
                                  (__position_00._M_current)->part = local_f8._12_4_;
                                  ppBVar1 = &(this->super_BRDFileBase).pins.
                                             super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppBVar1 = *ppBVar1 + 1;
                                }
                                break;
                              case (BRDPoint)0x4:
                                if ((ulong)(this->super_BRDFileBase).num_nails <=
                                    (ulong)(((long)(this->super_BRDFileBase).nails.
                                                                                                      
                                                  super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->super_BRDFileBase).nails.
                                                                                                      
                                                  super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x5555555555555555)) {
                                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_148,
                                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
                                             ,"");
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_148)
                                  ;
                                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                                  psVar25 = (size_type *)(plVar22 + 2);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)*plVar22 ==
                                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)psVar25) {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188.field_2._8_8_ = plVar22[3];
                                  }
                                  else {
                                    local_188.field_2._M_allocated_capacity = *psVar25;
                                    local_188._M_dataplus._M_p = (pointer)*plVar22;
                                  }
                                  local_188._M_string_length = plVar22[1];
                                  *plVar22 = (long)psVar25;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  std::__cxx11::to_string(&local_128,0x7f);
                                  std::operator+(&local_168,&local_188,&local_128);
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168)
                                  ;
                                  local_1e8 = &local_1d8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1d8 = *plVar26;
                                    lStack_1d0 = plVar22[3];
                                  }
                                  else {
                                    local_1d8 = *plVar26;
                                    local_1e8 = (long *)*plVar22;
                                  }
                                  local_1e0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8)
                                  ;
                                  local_1c8 = &local_1b8;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_1b8 = *plVar26;
                                    lStack_1b0 = plVar22[3];
                                  }
                                  else {
                                    local_1b8 = *plVar26;
                                    local_1c8 = (long *)*plVar22;
                                  }
                                  local_1c0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8)
                                  ;
                                  local_1a8 = &local_198;
                                  plVar26 = plVar22 + 2;
                                  if ((long *)*plVar22 == plVar26) {
                                    local_198 = *plVar26;
                                    lStack_190 = plVar22[3];
                                  }
                                  else {
                                    local_198 = *plVar26;
                                    local_1a8 = (long *)*plVar22;
                                  }
                                  local_1a0 = plVar22[1];
                                  *plVar22 = (long)plVar26;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1a8)
                                  ;
                                  local_208._0_8_ = local_208 + 0x10;
                                  ppcVar36 = (char **)(plVar22 + 2);
                                  if ((char **)*plVar22 == ppcVar36) {
                                    local_208._16_8_ = *ppcVar36;
                                    ppcStack_1f0 = (char **)plVar22[3];
                                  }
                                  else {
                                    local_208._16_8_ = *ppcVar36;
                                    local_208._0_8_ = (char **)*plVar22;
                                  }
                                  local_208._8_8_ = plVar22[1];
                                  *plVar22 = (long)ppcVar36;
                                  plVar22[1] = 0;
                                  *(undefined1 *)(plVar22 + 2) = 0;
                                  pBVar16 = (BRDPoint *)std::__cxx11::string::append(local_208);
                                  BVar18 = (BRDPoint)(pBVar16 + 2);
                                  if (*pBVar16 == BVar18) {
                                    local_f8._16_8_ = *(undefined8 *)BVar18;
                                    aStack_e0._M_allocated_capacity = (size_type)pBVar16[3];
                                    local_f8._0_8_ = (long)local_f8 + 0x10;
                                  }
                                  else {
                                    local_f8._16_8_ = *(undefined8 *)BVar18;
                                    local_f8._0_8_ = *pBVar16;
                                  }
                                  local_f8._8_8_ = pBVar16[1];
                                  *pBVar16 = BVar18;
                                  pBVar16[1].x = 0;
                                  pBVar16[1].y = 0;
                                  *(undefined1 *)&pBVar16[2].x = 0;
                                  std::__cxx11::string::operator=(local_108,(string *)local_f8);
                                  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                                    operator_delete((void *)local_f8._0_8_,
                                                    (ulong)((long)(_Hash_node_base **)
                                                                  local_f8._16_8_ + 1));
                                  }
                                  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
                                    operator_delete((void *)local_208._0_8_,
                                                    (ulong)(local_208._16_8_ + 1));
                                  }
                                  if (local_1a8 != &local_198) {
                                    operator_delete(local_1a8,local_198 + 1);
                                  }
                                  if (local_1c8 != &local_1b8) {
                                    operator_delete(local_1c8,local_1b8 + 1);
                                  }
                                  if (local_1e8 != &local_1d8) {
                                    operator_delete(local_1e8,local_1d8 + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                                    operator_delete(local_168._M_dataplus._M_p,
                                                    local_168.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_128._M_dataplus._M_p != &local_128.field_2) {
                                    operator_delete(local_128._M_dataplus._M_p,
                                                    local_128.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                                    operator_delete(local_188._M_dataplus._M_p,
                                                    local_188.field_2._M_allocated_capacity + 1);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                                    operator_delete(local_148._M_dataplus._M_p,
                                                    local_148.field_2._M_allocated_capacity + 1);
                                  }
                                  SDL_LogError(1,"%s",*(undefined8 *)local_108);
                                }
                                local_208._0_8_ = (char **)0x0;
                                local_208._8_8_ = (char **)0x0;
                                local_208._16_8_ = "UNCONNECTED";
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                local_208._0_4_ = uVar14;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_208._4_4_ = (int)lVar17;
                                lVar17 = strtol((char *)local_100,(char **)local_100,10);
                                local_208._8_4_ = (int)lVar17;
                                uVar14 = BRDFile::anon_class_16_2_d7082a65::operator()
                                                   ((anon_class_16_2_d7082a65 *)local_100);
                                local_208._12_4_ = (uVar14 == 1) + 1;
                                local_f8._8_8_ = &local_70;
                                local_f8._16_8_ = &local_98;
                                aStack_e0._M_allocated_capacity = (size_type)&local_a0;
                                local_f8._0_8_ = local_100;
                                BVar18 = (BRDPoint)
                                         BRDFile::anon_class_32_4_fa413470::operator()
                                                   ((anon_class_32_4_fa413470 *)local_f8);
                                __position._M_current =
                                     (this->super_BRDFileBase).nails.
                                     super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                local_208._16_8_ = BVar18;
                                if (__position._M_current ==
                                    (this->super_BRDFileBase).nails.
                                    super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<BRDNail,std::allocator<BRDNail>>::
                                  _M_realloc_insert<BRDNail_const&>
                                            (local_48,__position,(BRDNail *)local_208);
                                  BVar18 = extraout_RAX;
                                }
                                else {
                                  (__position._M_current)->net = (char *)BVar18;
                                  (__position._M_current)->probe = local_208._0_4_;
                                  ((__position._M_current)->pos).x = local_208._4_4_;
                                  *(undefined8 *)&((__position._M_current)->pos).y = local_208._8_8_
                                  ;
                                  ppBVar2 = &(this->super_BRDFileBase).nails.
                                             super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppBVar2 = *ppBVar2 + 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar35 = iVar13;
          uVar30 = uVar30 + 8;
        } while (uVar30 != uVar21);
        local_108 = (string *)CONCAT71(BVar18._1_7_,iVar35 != 0);
      }
      local_f8._0_8_ = &uStack_c8;
      local_f8._8_8_ = (char **)0x1;
      local_f8._16_8_ = (_Hash_node_base *)0x0;
      aStack_e0._M_allocated_capacity = 0;
      aStack_e0._8_4_ = 0x3f800000;
      pcStack_d0 = (char *)0x0;
      uStack_c8 = 0;
      iStack_c4 = 0;
      pBVar32 = (this->super_BRDFileBase).nails.
                super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar7 = (this->super_BRDFileBase).nails.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar32 != pBVar7) {
        do {
          pcVar8 = pBVar32->net;
          local_208._0_4_ = pBVar32->probe;
          ppcVar19 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_f8,(key_type *)local_208);
          *ppcVar19 = pcVar8;
          pBVar32 = pBVar32 + 1;
        } while (pBVar32 != pBVar7);
      }
      pBVar12 = local_a8;
      pBVar34 = (local_a8->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar9 = (local_a8->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pBVar34 != pBVar9) {
        do {
          if (*pBVar34->net == '\0') {
            iVar20 = std::
                     _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_f8,&pBVar34->probe);
            if (iVar20.super__Node_iterator_base<std::pair<const_int,_const_char_*>,_false>._M_cur
                == (__node_type *)0x0) {
              uVar21 = std::__throw_out_of_range("_Map_base::at");
              std::
              _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)local_f8);
              if ((long *)local_68._M_allocated_capacity != (long *)0x0) {
                operator_delete((void *)local_68._M_allocated_capacity,local_58 - local_68._0_8_);
              }
              BRDFileBase::~BRDFileBase(local_a8);
              _Unwind_Resume(uVar21);
            }
            pBVar34->net = *(char **)((long)iVar20.
                                            super__Node_iterator_base<std::pair<const_int,_const_char_*>,_false>
                                            ._M_cur + 0x10);
          }
          BVar5 = (pBVar12->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                  super__Vector_impl_data._M_start[pBVar34->part - 1].mounting_side;
          if (BVar5 < (Top|Bottom)) {
            pBVar34->side = BVar5;
          }
          pBVar34 = pBVar34 + 1;
        } while (pBVar34 != pBVar9);
      }
      pBVar12->valid = SUB81(local_108,0);
      std::
      _Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_const_char_*>,_std::allocator<std::pair<const_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_f8);
      if ((long *)local_68._M_allocated_capacity == (long *)0x0) {
        return;
      }
      operator_delete((void *)local_68._M_allocated_capacity,local_58 - local_68._0_8_);
      return;
    }
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
               ,"");
    plVar22 = (long *)std::__cxx11::string::append((char *)&local_148);
    paVar4 = &local_188.field_2;
    puVar29 = (ulong *)(plVar22 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar22 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar29) {
      local_188.field_2._M_allocated_capacity = *puVar29;
      local_188.field_2._8_8_ = plVar22[3];
      local_188._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar29;
      local_188._M_dataplus._M_p = (pointer)*plVar22;
    }
    local_188._M_string_length = plVar22[1];
    *plVar22 = (long)puVar29;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_128,'\x02');
    pcVar11 = local_128._M_dataplus._M_p;
    pcVar11[0] = '3';
    pcVar11[1] = '1';
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar4) {
      uVar21 = local_188.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_128._M_string_length + local_188._M_string_length) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar21 = local_128.field_2._M_allocated_capacity;
      }
      if (local_128._M_string_length + local_188._M_string_length <= (ulong)uVar21) {
        puVar23 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_128,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
        goto LAB_0013a038;
      }
    }
    puVar23 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_128._M_dataplus._M_p);
LAB_0013a038:
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    psVar25 = puVar23 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar23 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar25) {
      local_168.field_2._M_allocated_capacity = *psVar25;
      local_168.field_2._8_8_ = puVar23[3];
    }
    else {
      local_168.field_2._M_allocated_capacity = *psVar25;
      local_168._M_dataplus._M_p = (pointer)*puVar23;
    }
    local_168._M_string_length = puVar23[1];
    *puVar23 = psVar25;
    puVar23[1] = 0;
    *(undefined1 *)psVar25 = 0;
    plVar22 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_1e8 = &local_1d8;
    plVar26 = plVar22 + 2;
    if ((long *)*plVar22 == plVar26) {
      local_1d8 = *plVar26;
      lStack_1d0 = plVar22[3];
    }
    else {
      local_1d8 = *plVar26;
      local_1e8 = (long *)*plVar22;
    }
    local_1e0 = plVar22[1];
    *plVar22 = (long)plVar26;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_1c8 = &local_1b8;
    plVar26 = plVar22 + 2;
    if ((long *)*plVar22 == plVar26) {
      local_1b8 = *plVar26;
      lStack_1b0 = plVar22[3];
    }
    else {
      local_1b8 = *plVar26;
      local_1c8 = (long *)*plVar22;
    }
    local_1c0 = plVar22[1];
    *plVar22 = (long)plVar26;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = &local_198;
    plVar26 = plVar22 + 2;
    if ((long *)*plVar22 == plVar26) {
      local_198 = *plVar26;
      lStack_190 = plVar22[3];
    }
    else {
      local_198 = *plVar26;
      local_1a8 = (long *)*plVar22;
    }
    local_1a0 = plVar22[1];
    *plVar22 = (long)plVar26;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    plVar22 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    ppcVar36 = (char **)(plVar22 + 2);
    if ((char **)*plVar22 == ppcVar36) {
      local_208._16_8_ = *ppcVar36;
      ppcStack_1f0 = (char **)plVar22[3];
      local_208._0_8_ = local_208 + 0x10;
    }
    else {
      local_208._16_8_ = *ppcVar36;
      local_208._0_8_ = (char **)*plVar22;
    }
    local_208._8_8_ = plVar22[1];
    *plVar22 = (long)ppcVar36;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    pvVar24 = (value_type *)std::__cxx11::string::append(local_208);
    vVar28 = (value_type)(pvVar24 + 2);
    if (*pvVar24 == vVar28) {
      local_f8._16_8_ = *(undefined8 *)vVar28;
      aStack_e0._M_allocated_capacity = (size_type)pvVar24[3];
      local_f8._0_8_ = (long)local_f8 + 0x10;
    }
    else {
      local_f8._16_8_ = *(undefined8 *)vVar28;
      local_f8._0_8_ = *pvVar24;
    }
    local_f8._8_8_ = pvVar24[1];
    *pvVar24 = vVar28;
    pvVar24[1].x = 0;
    pvVar24[1].y = 0;
    *(undefined1 *)&pvVar24[2].x = 0;
    psVar3 = &local_a8->error_msg;
    std::__cxx11::string::operator=((string *)psVar3,(string *)local_f8);
    if (local_f8._0_8_ != (long)local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(_Hash_node_base **)local_f8._16_8_ + 1))
      ;
    }
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != paVar4) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    SDL_LogError(1,"%s",(psVar3->_M_dataplus)._M_p);
    return;
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRDFile.cpp"
             ,"");
  plVar22 = (long *)std::__cxx11::string::append((char *)&local_148);
  paVar4 = &local_188.field_2;
  puVar29 = (ulong *)(plVar22 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar22 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar29) {
    local_188.field_2._M_allocated_capacity = *puVar29;
    local_188.field_2._8_8_ = plVar22[3];
    local_188._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar29;
    local_188._M_dataplus._M_p = (pointer)*plVar22;
  }
  local_188._M_string_length = plVar22[1];
  *plVar22 = (long)puVar29;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x02');
  pcVar11 = local_128._M_dataplus._M_p;
  pcVar11[0] = '2';
  pcVar11[1] = '8';
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    uVar21 = local_188.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_128._M_string_length + local_188._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      uVar21 = local_128.field_2._M_allocated_capacity;
    }
    if (local_128._M_string_length + local_188._M_string_length <= (ulong)uVar21) {
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_128,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
      goto LAB_00139c28;
    }
  }
  puVar23 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_128._M_dataplus._M_p);
LAB_00139c28:
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  psVar25 = puVar23 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar23 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar25) {
    local_168.field_2._M_allocated_capacity = *psVar25;
    local_168.field_2._8_8_ = puVar23[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *psVar25;
    local_168._M_dataplus._M_p = (pointer)*puVar23;
  }
  local_168._M_string_length = puVar23[1];
  *puVar23 = psVar25;
  puVar23[1] = 0;
  *(undefined1 *)psVar25 = 0;
  plVar22 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_1e8 = &local_1d8;
  plVar26 = plVar22 + 2;
  if ((long *)*plVar22 == plVar26) {
    local_1d8 = *plVar26;
    lStack_1d0 = plVar22[3];
  }
  else {
    local_1d8 = *plVar26;
    local_1e8 = (long *)*plVar22;
  }
  local_1e0 = plVar22[1];
  *plVar22 = (long)plVar26;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1c8 = &local_1b8;
  plVar26 = plVar22 + 2;
  if ((long *)*plVar22 == plVar26) {
    local_1b8 = *plVar26;
    lStack_1b0 = plVar22[3];
  }
  else {
    local_1b8 = *plVar26;
    local_1c8 = (long *)*plVar22;
  }
  local_1c0 = plVar22[1];
  *plVar22 = (long)plVar26;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = &local_198;
  plVar26 = plVar22 + 2;
  if ((long *)*plVar22 == plVar26) {
    local_198 = *plVar26;
    lStack_190 = plVar22[3];
  }
  else {
    local_198 = *plVar26;
    local_1a8 = (long *)*plVar22;
  }
  local_1a0 = plVar22[1];
  *plVar22 = (long)plVar26;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  plVar22 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  ppcVar36 = (char **)(plVar22 + 2);
  if ((char **)*plVar22 == ppcVar36) {
    local_208._16_8_ = *ppcVar36;
    ppcStack_1f0 = (char **)plVar22[3];
    local_208._0_8_ = local_208 + 0x10;
  }
  else {
    local_208._16_8_ = *ppcVar36;
    local_208._0_8_ = (char **)*plVar22;
  }
  local_208._8_8_ = plVar22[1];
  *plVar22 = (long)ppcVar36;
  plVar22[1] = 0;
  *(undefined1 *)(plVar22 + 2) = 0;
  pvVar24 = (value_type *)std::__cxx11::string::append(local_208);
  vVar28 = (value_type)(pvVar24 + 2);
  if (*pvVar24 == vVar28) {
    local_f8._16_8_ = *(undefined8 *)vVar28;
    aStack_e0._M_allocated_capacity = (size_type)pvVar24[3];
    local_f8._0_8_ = (long)local_f8 + 0x10;
  }
  else {
    local_f8._16_8_ = *(undefined8 *)vVar28;
    local_f8._0_8_ = *pvVar24;
  }
  local_f8._8_8_ = pvVar24[1];
  *pvVar24 = vVar28;
  pvVar24[1].x = 0;
  pvVar24[1].y = 0;
  *(undefined1 *)&pvVar24[2].x = 0;
  psVar3 = &((BRDFileBase *)&local_a8->_vptr_BRDFileBase)->error_msg;
  std::__cxx11::string::operator=((string *)psVar3,(string *)local_f8);
  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,(ulong)((long)(_Hash_node_base **)local_f8._16_8_ + 1));
  }
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar4) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  SDL_LogError(1,"%s",(psVar3->_M_dataplus)._M_p);
  return;
}

Assistant:

BRDFile::BRDFile(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	// decode the file if it appears to be encoded:
	static const uint8_t encoded_header[] = {0x23, 0xe2, 0x63, 0x28};
	if (!memcmp(file_buf, encoded_header, 4)) {
		for (size_t i = 0; i < buffer_size; i++) {
			char x = file_buf[i];
			if (!(x == '\r' || x == '\n' || !x)) {
				int c = x;
				x     = ~(((c >> 6) & 3) | (c << 2));
			}
			file_buf[i] = x;
		}
	}

	int current_block = 0;
	std::vector<char*> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;
		if (!strcmp(line, "str_length:")) {
			current_block = 1;
			continue;
		}
		if (!strcmp(line, "var_data:")) {
			current_block = 2;
			continue;
		}
		if (!strcmp(line, "Format:") || !strcmp(line, "format:")) {
			current_block = 3;
			continue;
		}
		if (!strcmp(line, "Parts:") || !strcmp(line, "Pins1:")) {
			current_block = 4;
			continue;
		}
		if (!strcmp(line, "Pins:") || !strcmp(line, "Pins2:")) {
			current_block = 5;
			continue;
		}
		if (!strcmp(line, "Nails:")) {
			current_block = 6;
			continue;
		}

		char *p = line;
		char *s;
		unsigned int tmp = 0;

		switch (current_block) {
			case 2: { // var_data
				num_format = READ_UINT();
				num_parts  = READ_UINT();
				num_pins   = READ_UINT();
				num_nails  = READ_UINT();
			} break;
			case 3: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint fmt;
				fmt.x = strtol(p, &p, 10);
				fmt.y = strtol(p, &p, 10);
				format.push_back(fmt);
			} break;
			case 4: { // Parts
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;
				part.name      = READ_STR();
				tmp            = READ_UINT(); // Type and layer, actually.
				part.part_type = (tmp & 0xc) ? BRDPartType::SMD : BRDPartType::ThroughHole;
				if (tmp == 1 || (4 <= tmp && tmp < 8)) part.mounting_side = BRDPartMountingSide::Top;
				if (tmp == 2 || (8 <= tmp)) part.mounting_side            = BRDPartMountingSide::Bottom;
				part.end_of_pins                                          = READ_UINT();
				ENSURE(part.end_of_pins <= num_pins, error_msg);
				parts.push_back(part);
			} break;
			case 5: { // Pins
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;
				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				pin.probe = READ_INT(); // Can be negative (-99)
				pin.part  = READ_UINT();
				ENSURE(pin.part <= num_parts, error_msg);
				pin.net = READ_STR();
				pins.push_back(pin);
			} break;
			case 6: { // Nails
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;
				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				nail.side  = READ_UINT() == 1 ? BRDPartMountingSide::Top : BRDPartMountingSide::Bottom;
				nail.net   = READ_STR();
				nails.push_back(nail);
			} break;
		}
	}

	// Lenovo brd variant, find net from nail
	std::unordered_map<int, const char *> nailsToNets; // Map between net id and net name
	for (auto &nail : nails) {
		nailsToNets[nail.probe] = nail.net;
	}

	for (auto &pin : pins) {
		if (!strcmp(pin.net, "")) {
			try {
				pin.net = nailsToNets.at(pin.probe);
			} catch (const std::out_of_range &e) {
				pin.net = "";
			}
		}
		switch (parts[pin.part - 1].mounting_side) {
			case BRDPartMountingSide::Top:    pin.side = BRDPinSide::Top;    break;
			case BRDPartMountingSide::Bottom: pin.side = BRDPinSide::Bottom; break;
			case BRDPartMountingSide::Both:   pin.side = BRDPinSide::Both;   break;
		}
	}

	valid = current_block != 0;
}